

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratorInfoBase.hpp
# Opt level: O0

void __thiscall
GeneratorInfoBase::GeneratorInfoBase
          (GeneratorInfoBase *this,QAM *finalam,int deriv,OptionMap *options)

{
  undefined4 in_EDX;
  undefined8 *in_RDI;
  QAM *in_stack_ffffffffffffffb8;
  QAM *this_00;
  
  *in_RDI = &PTR__GeneratorInfoBase_00199bb8;
  this_00 = (QAM *)(in_RDI + 1);
  QAM::QAM(this_00,in_stack_ffffffffffffffb8);
  *(undefined4 *)(in_RDI + 7) = in_EDX;
  std::map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>::map
            ((map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_> *)
             this_00,(map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
                      *)in_stack_ffffffffffffffb8);
  return;
}

Assistant:

GeneratorInfoBase(QAM finalam, int deriv, const OptionMap & options)
        : finalam_(finalam), deriv_(deriv), options_(options) { }